

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * executeArray(Object *__return_storage_ptr__,ArrayInit ai,Environment *env)

{
  Expression *pEVar1;
  Literal LVar2;
  LiteralType LStack_3c;
  Literal init;
  Expression *iden;
  int i;
  Environment *env_local;
  ArrayInit ai_local;
  
  iden._4_4_ = 0;
  while( true ) {
    env_local._4_4_ = ai.count;
    if (env_local._4_4_ <= iden._4_4_) {
      memcpy(__return_storage_ptr__,&nullObject,0x40);
      return __return_storage_ptr__;
    }
    pEVar1 = ai.initializers[iden._4_4_];
    env_local._0_4_ = ai.line;
    LVar2 = resolveLiteral((pEVar1->field_1).binary.left,(int)env_local,env);
    LStack_3c = LVar2.type;
    if (LStack_3c != LIT_INT) break;
    init._0_8_ = LVar2.field_2;
    env_arr_new((pEVar1->field_1).arrayExpression.identifier,(int)env_local,init._0_8_,env);
    iden._4_4_ = iden._4_4_ + 1;
  }
  printf("\x1b[31m\n[Runtime Error] [Line:%d] Array dimension must be an integer!\x1b[0m",
         ai._0_8_ & 0xffffffff);
  stop();
  memcpy(__return_storage_ptr__,&nullObject,0x40);
  return __return_storage_ptr__;
}

Assistant:

static Object executeArray(ArrayInit ai, Environment *env){
    int i = 0;
    while(i < ai.count){
        Expression *iden = ai.initializers[i];
        Literal init = resolveLiteral(iden->arrayExpression.index, ai.line, env);
        if(init.type != LIT_INT){
            printf(runtime_error("Array dimension must be an integer!"), ai.line);
            stop();
            return nullObject;
        }
        env_arr_new(iden->arrayExpression.identifier, ai.line, init.iVal, env);
        i++;
    }
    return nullObject;
}